

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

result __thiscall
fmt::v7::detail::fixed_handler::on_start
          (fixed_handler *this,uint64_t divisor,uint64_t remainder,uint64_t error,int *exp)

{
  int iVar1;
  round_direction rVar2;
  char local_49;
  round_direction dir;
  int *exp_local;
  uint64_t error_local;
  uint64_t remainder_local;
  uint64_t divisor_local;
  fixed_handler *this_local;
  
  if ((this->fixed & 1U) == 0) {
    this_local._4_4_ = more;
  }
  else {
    this->precision = *exp + this->exp10 + this->precision;
    if (this->precision < 1) {
      if (this->precision < 0) {
        this_local._4_4_ = done;
      }
      else {
        rVar2 = get_round_direction(divisor,remainder,error);
        if (rVar2 == unknown) {
          this_local._4_4_ = error;
        }
        else {
          local_49 = '1';
          if (rVar2 != up) {
            local_49 = '0';
          }
          iVar1 = this->size;
          this->size = iVar1 + 1;
          this->buf[iVar1] = local_49;
          this_local._4_4_ = done;
        }
      }
    }
    else {
      this_local._4_4_ = more;
    }
  }
  return this_local._4_4_;
}

Assistant:

digits::result on_start(uint64_t divisor, uint64_t remainder, uint64_t error,
                          int& exp) {
    // Non-fixed formats require at least one digit and no precision adjustment.
    if (!fixed) return digits::more;
    // Adjust fixed precision by exponent because it is relative to decimal
    // point.
    precision += exp + exp10;
    // Check if precision is satisfied just by leading zeros, e.g.
    // format("{:.2f}", 0.001) gives "0.00" without generating any digits.
    if (precision > 0) return digits::more;
    if (precision < 0) return digits::done;
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir == round_direction::unknown) return digits::error;
    buf[size++] = dir == round_direction::up ? '1' : '0';
    return digits::done;
  }